

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  long *plVar1;
  byte *pbVar2;
  unsigned_short *puVar3;
  uchar uVar4;
  char cVar5;
  longlong *plVar6;
  longlong *plVar7;
  longlong *plVar8;
  size_t __n;
  char *pcVar9;
  pointer puVar10;
  undefined2 uVar11;
  int iVar12;
  int iVar13;
  unsigned_short *puVar14;
  ulong uVar15;
  long *plVar16;
  mz_ulong __n_00;
  uchar *puVar17;
  ushort *puVar18;
  char *pcVar19;
  void *pvVar20;
  longlong **pplVar21;
  longlong *hcode;
  undefined8 uVar22;
  long lVar23;
  ushort *puVar24;
  uchar uVar25;
  long lVar26;
  char *pcVar27;
  ushort *puVar28;
  ushort uVar29;
  uint uVar30;
  value_type_conflict6 *__val;
  pointer pPVar31;
  int *piVar32;
  byte bVar33;
  int iVar34;
  value_type_conflict7 *__val_1;
  ushort uVar35;
  int iVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  ushort *puVar40;
  int iVar41;
  void *pvVar42;
  ushort *puVar43;
  int *piVar44;
  char cVar45;
  uint uVar46;
  short bs_1;
  uint uVar47;
  long lVar48;
  ushort uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  long lVar53;
  pointer pPVar54;
  short as;
  ulong uVar55;
  longlong **pplVar56;
  uint uVar57;
  value_type_conflict3 *__val_2;
  ulong uVar58;
  unsigned_short *puVar59;
  int i_1;
  pointer __n_01;
  ulong uVar60;
  bool bVar61;
  undefined4 in_stack_00000014;
  _Iter_comp_iter<tinyexr::FHeapCompare> __cmp;
  undefined4 in_stack_0000001c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  int n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  void *local_1a0;
  allocator_type local_191;
  ulong local_190;
  longlong **local_188;
  longlong **local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  long *local_160;
  void *local_158;
  pointer local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  ushort *local_130;
  ushort *local_128;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> local_120;
  ulong local_108;
  ushort *local_100;
  ulong local_f8;
  long local_f0;
  uint local_e8;
  int local_e4;
  long local_e0;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_d8;
  long local_d0;
  ulong local_c8;
  int *local_c0;
  long local_b8;
  int *local_b0;
  uint local_a4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  void *local_88;
  pointer local_80;
  pointer local_78;
  longlong **local_70;
  ushort *local_68;
  long local_60;
  ulong local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_158 = (void *)CONCAT44(local_158._4_4_,param_6);
  local_1a0 = (void *)CONCAT44(local_1a0._4_4_,width);
  local_128 = (ushort *)CONCAT44(local_128._4_4_,compression_type);
  local_188 = (longlong **)(long)x_stride;
  pPVar31 = (pointer)CONCAT44(in_stack_0000001c,num_lines);
  lVar53 = (long)param_4;
  local_d8 = (vector<unsigned_char,std::allocator<unsigned_char>> *)out_data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_148,(long)local_188 * lVar53 * CONCAT44(in_stack_00000014,line_no),
             (allocator_type *)&local_178);
  puVar14 = pPVar31->start;
  if (pPVar31->end != puVar14) {
    lVar23 = (long)(int)local_158;
    lVar26 = (long)width;
    local_1a0 = (void *)((ulong)local_188 & 0xffffffff);
    uVar58 = (ulong)(uint)param_4;
    local_190 = lVar23 * lVar26 * 4;
    local_158 = (void *)(lVar26 * 4);
    local_160 = (long *)(lVar23 * lVar26 * 2);
    local_100 = (ushort *)(lVar26 * 2);
    uVar55 = 0;
    local_180 = (longlong **)CONCAT44(local_180._4_4_,param_4);
    do {
      lVar23 = CONCAT44(in_stack_00000014,line_no);
      iVar12 = *(int *)(puVar14 + uVar55 * 0x1c + 0x10);
      if (iVar12 == 2) {
        if (*(int *)(puVar14 + uVar55 * 0x1c + 0x12) == 1) {
          if (0 < (int)(uint)local_188) {
            lVar23 = 0;
            pvVar42 = (void *)0x0;
            uVar15 = local_190;
            do {
              lVar26 = *(long *)(*(long *)pixel_data_size + uVar55 * 8);
              pPVar54 = (pointer)CONCAT44(local_148.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_148.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pPVar54)
                  <= (ulong)(((long)pvVar42 * CONCAT44(in_stack_00000014,line_no) + lVar26) * lVar53
                            )) goto LAB_00222dae;
              pPVar31 = pPVar54;
              if (0 < param_4) {
                lVar26 = (lVar26 + lVar23) * lVar53;
                uVar37 = 0;
                do {
                  uVar50 = *(uint *)(images[uVar55] + uVar37 * 4 + uVar15);
                  uVar38 = uVar50 >> 0x17;
                  uVar39 = uVar38 & 0xff;
                  if ((char)uVar38 != '\0') {
                    if (uVar39 == 0xff) {
                      uVar39 = ((uVar50 & 0x7fffff) != 0 | 0x3e) << 9;
                    }
                    else {
                      uVar57 = 0x7c00;
                      if (uVar39 < 0x8f) {
                        if (uVar39 < 0x71) {
                          uVar57 = 0;
                          if (uVar39 < 0x66) goto LAB_002216e6;
                          uVar46 = uVar50 & 0x7fffff | 0x800000;
                          uVar57 = uVar46 >> (0x7eU - (char)uVar38 & 0x1f);
                          uVar46 = uVar46 >> (0x7d - uVar39 & 0x1f);
                        }
                        else {
                          uVar57 = (uVar50 >> 0xd & 0x3ff | (uVar38 & 0x1f) << 10) ^ 0x4000;
                          uVar46 = uVar50 >> 0xc;
                        }
                        uVar57 = uVar57 + ((uVar46 & 1) != 0);
                      }
LAB_002216e6:
                      uVar39 = uVar57 & 0x7fff;
                    }
                  }
                  uVar50 = uVar50 >> 0x10 & 0x8000 | uVar39;
                  pPVar31 = (pointer)(ulong)uVar50;
                  *(uchar *)((long)&pPVar54->start + uVar37 * 2 + lVar26) = (uchar)uVar39;
                  *(uchar *)((long)&pPVar54->start + uVar37 * 2 + lVar26 + 1) = (uchar)(uVar50 >> 8)
                  ;
                  uVar37 = uVar37 + 1;
                } while (uVar58 != uVar37);
              }
              pvVar42 = (void *)((long)pvVar42 + 1);
              lVar23 = lVar23 + CONCAT44(in_stack_00000014,line_no);
              uVar15 = uVar15 + (long)local_158;
            } while (pvVar42 != local_1a0);
          }
        }
        else {
          if (*(int *)(puVar14 + uVar55 * 0x1c + 0x12) != 2) {
LAB_00221b6f:
            if (channels !=
                (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
              std::__cxx11::string::append((char *)channels);
            }
            goto LAB_00221e33;
          }
          if (0 < (int)(uint)local_188) {
            lVar23 = 0;
            pvVar42 = (void *)0x0;
            uVar15 = local_190;
            do {
              lVar26 = *(long *)(*(long *)pixel_data_size + uVar55 * 8);
              pPVar31 = (pointer)CONCAT44(local_148.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_148.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pPVar31)
                  <= (ulong)(((long)pvVar42 * CONCAT44(in_stack_00000014,line_no) + lVar26) * lVar53
                            )) goto LAB_00222da0;
              if (0 < param_4) {
                uVar37 = 0;
                do {
                  *(undefined4 *)((long)&pPVar31->start + uVar37 * 4 + (lVar26 + lVar23) * lVar53) =
                       *(undefined4 *)(images[uVar55] + uVar37 * 4 + uVar15);
                  uVar37 = uVar37 + 1;
                } while (uVar58 != uVar37);
              }
              pvVar42 = (void *)((long)pvVar42 + 1);
              lVar23 = lVar23 + CONCAT44(in_stack_00000014,line_no);
              uVar15 = uVar15 + (long)local_158;
            } while (pvVar42 != local_1a0);
          }
        }
      }
      else if (iVar12 == 1) {
        if (*(int *)(puVar14 + uVar55 * 0x1c + 0x12) == 2) {
          if (0 < (int)(uint)local_188) {
            lVar26 = 0;
            pvVar42 = (void *)0x0;
            plVar16 = local_160;
            do {
              lVar48 = *(long *)(*(long *)pixel_data_size + uVar55 * 8);
              pPVar54 = (pointer)CONCAT44(local_148.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_148.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pPVar54)
                  <= (ulong)(((long)pvVar42 * lVar23 + lVar48) * lVar53)) goto LAB_00222dbc;
              pPVar31 = pPVar54;
              if (0 < param_4) {
                lVar48 = (lVar48 + lVar26) * lVar53;
                uVar15 = 0;
                do {
                  uVar29 = *(ushort *)(images[uVar55] + (long)plVar16 + uVar15 * 2);
                  uVar50 = (uint)uVar29 << 0xd;
                  if ((uVar50 & 0xf800000) == 0xf800000) {
                    pPVar31 = (pointer)(ulong)(uVar50 | 0x70000000);
                  }
                  else if ((uVar50 & 0xf800000) == 0) {
                    pPVar31 = (pointer)(ulong)(uint)((float)(uVar50 | 0x38800000) + -6.1035156e-05);
                  }
                  else {
                    pPVar31 = (pointer)(ulong)((uVar50 & 0xfffe000) + 0x38000000);
                  }
                  *(uchar *)((long)&pPVar54->start + uVar15 * 4 + lVar48) = (uchar)pPVar31;
                  *(uchar *)((long)&pPVar54->start + uVar15 * 4 + lVar48 + 1) =
                       (uchar)((ulong)pPVar31 >> 8);
                  *(uchar *)((long)&pPVar54->start + uVar15 * 4 + lVar48 + 2) =
                       (uchar)((ulong)pPVar31 >> 0x10);
                  *(byte *)((long)&pPVar54->start + uVar15 * 4 + lVar48 + 3) =
                       (byte)((short)uVar29 >> 0xf) & 0x80 | (byte)((ulong)pPVar31 >> 0x18);
                  uVar15 = uVar15 + 1;
                } while (uVar58 != uVar15);
              }
              pvVar42 = (void *)((long)pvVar42 + 1);
              lVar26 = lVar26 + lVar23;
              plVar16 = (long *)((long)plVar16 + (long)local_100);
            } while (pvVar42 != local_1a0);
          }
        }
        else {
          if (*(int *)(puVar14 + uVar55 * 0x1c + 0x12) != 1) goto LAB_00221b6f;
          if (0 < (int)(uint)local_188) {
            lVar26 = 0;
            pvVar42 = (void *)0x0;
            plVar16 = local_160;
            do {
              lVar48 = *(long *)(*(long *)pixel_data_size + uVar55 * 8);
              pPVar31 = (pointer)CONCAT44(local_148.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_148.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pPVar31)
                  <= (ulong)(((long)pvVar42 * lVar23 + lVar48) * lVar53)) goto LAB_00222dca;
              if (0 < param_4) {
                uVar15 = 0;
                do {
                  *(undefined2 *)((long)&pPVar31->start + uVar15 * 2 + (lVar48 + lVar26) * lVar53) =
                       *(undefined2 *)(images[uVar55] + (long)plVar16 + uVar15 * 2);
                  uVar15 = uVar15 + 1;
                } while (uVar58 != uVar15);
              }
              pvVar42 = (void *)((long)pvVar42 + 1);
              lVar26 = lVar26 + lVar23;
              plVar16 = (long *)((long)plVar16 + (long)local_100);
            } while (pvVar42 != local_1a0);
          }
        }
      }
      else if ((iVar12 == 0) && (0 < (int)(uint)local_188)) {
        lVar23 = 0;
        pvVar42 = (void *)0x0;
        uVar15 = local_190;
        do {
          lVar26 = *(long *)(*(long *)pixel_data_size + uVar55 * 8);
          pPVar31 = (pointer)CONCAT44(local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)local_148.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
          if ((ulong)(CONCAT44(local_148.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               (int)local_148.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish) - (long)pPVar31) <=
              (ulong)(((long)pvVar42 * CONCAT44(in_stack_00000014,line_no) + lVar26) * lVar53)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00222da0:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00222dae:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00222dbc:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00222dca:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_00222dd8;
          }
          if (0 < param_4) {
            uVar37 = 0;
            do {
              *(undefined4 *)((long)&pPVar31->start + uVar37 * 4 + (lVar26 + lVar23) * lVar53) =
                   *(undefined4 *)(images[uVar55] + uVar37 * 4 + uVar15);
              uVar37 = uVar37 + 1;
            } while (uVar58 != uVar37);
          }
          pvVar42 = (void *)((long)pvVar42 + 1);
          lVar23 = lVar23 + CONCAT44(in_stack_00000014,line_no);
          uVar15 = uVar15 + (long)local_158;
        } while (pvVar42 != local_1a0);
      }
      uVar55 = uVar55 + 1;
      puVar14 = *(unsigned_short **)CONCAT44(in_stack_0000001c,num_lines);
    } while (uVar55 < (ulong)((((long *)CONCAT44(in_stack_0000001c,num_lines))[1] - (long)puVar14 >>
                              3) * 0x6db6db6db6db6db7));
  }
  if ((uint)local_128 == 0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_d8,*(undefined8 *)(local_d8 + 8),
               CONCAT44(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_148.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start),
               CONCAT44(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)local_148.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish));
LAB_00222d6d:
    bVar61 = true;
    goto LAB_00222d6f;
  }
  if (((uint)local_128 & 0xfffffffe) == 2) {
    __n_00 = mz_compressBound(CONCAT44(local_148.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       (int)local_148.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish) -
                              CONCAT44(local_148.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_148.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,__n_00,
               (allocator_type *)&local_178);
    pPVar54 = local_120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar31 = (pointer)((long)local_120.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_120.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    if (pPVar31 == (pointer)0x0) {
LAB_00222e16:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00222e28:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00222e3a:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    else {
      pvVar42 = (void *)CONCAT44(local_148.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      pcVar9 = (char *)CONCAT44(local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                (int)local_148.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
      __n_01 = (pointer)(pcVar9 + -(long)pvVar42);
      if (__n_01 == (pointer)0x0) goto LAB_00222e16;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_178,(size_type)__n_01,(allocator_type *)&local_a0);
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_00222e28;
      if (0 < (long)__n_01) {
        lVar53 = 0;
        do {
          pcVar19 = (char *)((long)pvVar42 + lVar53 * 2);
          *(char *)((long)local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar53) = *pcVar19;
          if (pcVar9 <= pcVar19 + 1) break;
          *(char *)((long)local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   lVar53 + ((ulong)((long)&__n_01->start + 1U) >> 1)) = pcVar19[1];
          lVar53 = lVar53 + 1;
        } while (pcVar19 + 2 < pcVar9);
      }
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_00222e3a;
      if (1 < (long)__n_01) {
        puVar17 = (uchar *)((long)local_178.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1);
        uVar25 = *local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          uVar4 = *puVar17;
          *puVar17 = (uVar4 - uVar25) + 0x80;
          puVar17 = puVar17 + 1;
          uVar25 = uVar4;
        } while (puVar17 < (uchar *)((long)local_178.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + (long)__n_01)
                );
      }
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)mz_compressBound((mz_ulong)__n_01);
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar12 = mz_compress((uchar *)pPVar54,(mz_ulong *)&local_a0,
                             local_178.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(mz_ulong)__n_01);
        if ((iVar12 == 0) &&
           (pPVar31 = (pointer)local_a0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
           __n_01 <= local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start)) {
          memcpy(pPVar54,pvVar42,(size_t)__n_01);
          pPVar31 = __n_01;
        }
        if ((ushort *)
            local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ushort *)0x0) {
          operator_delete(local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (iVar12 == 0) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_d8,*(undefined8 *)(local_d8 + 8),
                     local_120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (uchar *)((long)&(local_120.
                                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->start +
                              ((ulong)pPVar31 & 0xffffffff)));
        }
        else if (channels !=
                 (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
          std::__cxx11::string::append((char *)channels);
        }
        if (local_120.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (iVar12 != 0) goto LAB_00221e33;
        goto LAB_00222d6d;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00222e5e:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00222e70:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00222e82:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00222e94:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00222ea6:
    local_108 = 0;
LAB_00222eb2:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               local_108);
LAB_00222eca:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    if ((uint)local_128 == 0x80) {
      if (channels != (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0)
      {
        std::__cxx11::string::append((char *)channels);
      }
LAB_00221e33:
      bVar61 = false;
LAB_00222d6f:
      if ((void *)CONCAT44(local_148.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           (int)local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_148.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_148.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
      }
      return bVar61;
    }
    if ((uint)local_128 != 4) {
      if ((uint)local_128 != 1) goto LAB_00221e33;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
                 (ulong)((CONCAT44(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_148.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_148.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) * 3) >> 1,
                 (allocator_type *)&local_178);
      pPVar31 = local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start) goto LAB_00222e5e;
      pcVar9 = (char *)CONCAT44(local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_148.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
      pcVar19 = (char *)CONCAT44(local_148.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
      uVar58 = (long)pcVar19 - (long)pcVar9;
      if (uVar58 == 0) goto LAB_00222e5e;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_178,uVar58,(allocator_type *)&local_a0);
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_00222e70;
      if (0 < (long)uVar58) {
        puVar18 = (ushort *)
                  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pcVar27 = pcVar9;
        do {
          *(char *)puVar18 = *pcVar27;
          if (pcVar19 <= pcVar27 + 1) break;
          *(char *)((long)puVar18 + (uVar58 + 1 >> 1)) = pcVar27[1];
          puVar18 = (ushort *)((long)puVar18 + 1);
          pcVar27 = pcVar27 + 2;
        } while (pcVar27 < pcVar19);
      }
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_00222e82;
      if (1 < (long)uVar58) {
        pcVar19 = (char *)((long)local_178.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        cVar45 = *local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          cVar5 = *pcVar19;
          *pcVar19 = (cVar5 - cVar45) + -0x80;
          pcVar19 = pcVar19 + 1;
          cVar45 = cVar5;
        } while (pcVar19 < (char *)((long)local_178.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar58));
      }
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pPVar54 = pPVar31;
        if (0 < (int)uVar58) {
          puVar24 = (ushort *)
                    ((long)(int)uVar58 +
                    (long)local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
          puVar18 = (ushort *)
                    local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar28 = (ushort *)
                    local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar19 = (char *)(~(ulong)puVar18 + (long)puVar28);
            lVar53 = 1;
            lVar23 = 0;
            do {
              lVar48 = lVar23;
              lVar26 = lVar53;
              puVar40 = (ushort *)((long)puVar18 + lVar48 + 1);
              if (puVar24 <= puVar40) {
                pcVar19 = (char *)((long)puVar18 + (lVar48 - (long)puVar28) + 1);
                puVar43 = puVar40;
                if (2 < (long)pcVar19) goto LAB_00221b11;
                goto LAB_00221b39;
              }
              if ((long)pcVar19 < -0x7f) break;
              pcVar19 = pcVar19 + -1;
              lVar53 = lVar26 + 1;
              lVar23 = lVar48 + 1;
            } while ((char)*puVar28 == (char)*puVar40);
            pcVar19 = (char *)((long)puVar18 + ((lVar48 + 1) - (long)puVar28));
            if ((long)pcVar19 < 3) {
              puVar43 = (ushort *)((long)puVar18 + lVar48 + 2);
              cVar45 = (char)*puVar40;
              if (puVar43 < puVar24) {
                do {
                  lVar53 = lVar26;
                  puVar40 = (ushort *)((long)puVar18 + lVar53 + 2);
                  cVar5 = *(char *)((long)puVar18 + lVar53 + 1);
                  if ((cVar45 == cVar5) && (puVar40 < puVar24)) {
                    if ((0x7e < (long)((long)puVar18 + (lVar53 - (long)puVar28))) ||
                       (cVar45 == *(char *)((long)puVar18 + lVar53 + 2))) {
LAB_00221b2f:
                      puVar43 = (ushort *)((long)puVar18 + lVar53);
                      goto LAB_00221b39;
                    }
                  }
                  else if (0x7e < (long)((long)puVar18 + (lVar53 - (long)puVar28)))
                  goto LAB_00221b2f;
                  lVar26 = lVar53 + 1;
                  cVar45 = cVar5;
                } while (puVar40 < puVar24);
                puVar43 = (ushort *)((long)puVar18 + lVar53 + 2);
                if (0x7e < (long)((long)puVar18 + (lVar26 - (long)puVar28))) {
                  puVar43 = (ushort *)((long)puVar18 + lVar26);
                }
              }
LAB_00221b39:
              *(char *)&pPVar54->start = (char)puVar28 - (char)puVar43;
              pPVar54 = (pointer)((long)&pPVar54->start + 1);
              puVar18 = puVar43;
              if (puVar28 < puVar43) {
                lVar53 = (long)puVar43 - (long)puVar28;
                do {
                  uVar29 = *puVar28;
                  puVar28 = (ushort *)((long)puVar28 + 1);
                  *(uchar *)&pPVar54->start = (uchar)uVar29;
                  pPVar54 = (pointer)((long)&pPVar54->start + 1);
                  lVar53 = lVar53 + -1;
                } while (lVar53 != 0);
              }
            }
            else {
LAB_00221b11:
              *(uchar *)&pPVar54->start = (char)pcVar19 + 0xff;
              *(uchar *)((long)&pPVar54->start + 1) = (uchar)*puVar28;
              pPVar54 = (pointer)((long)&pPVar54->start + 2);
              puVar28 = (ushort *)((long)puVar18 + lVar48 + 1);
              puVar18 = puVar28;
            }
          } while (puVar28 < puVar24);
        }
        uVar50 = (int)pPVar54 - (int)pPVar31;
        if ((int)uVar50 < 1) goto LAB_00222eef;
        uVar55 = (ulong)(uVar50 & 0x7fffffff);
        if (uVar58 <= uVar55) {
          memcpy(pPVar31,pcVar9,uVar58);
          uVar55 = uVar58;
        }
        if ((ushort *)
            local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ushort *)0x0) {
          operator_delete(local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (local_d8,*(undefined8 *)(local_d8 + 8),
                   local_120.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (uchar *)((long)&(local_120.
                                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->start + uVar55));
        goto LAB_00222d63;
      }
      goto LAB_00222e94;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a0,
               (ulong)(((int)local_148.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_148.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) * 2 + 0x2000),
               (allocator_type *)&local_178);
    pplVar56 = local_188;
    local_80 = (pointer)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00222ea6;
    local_88 = (void *)CONCAT44(local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_148.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    uVar58 = CONCAT44(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)local_148.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish) - (long)local_88;
    local_108 = uVar58;
    if (uVar58 == 0) goto LAB_00222eb2;
    pPVar31 = (pointer)operator_new(0x2000);
    memset(pPVar31,0,0x2000);
    local_150 = pPVar31;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_178,uVar58 >> 1,
               (allocator_type *)&local_120);
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
              (&local_120,
               (((long *)CONCAT44(in_stack_0000001c,num_lines))[1] -
                *(long *)CONCAT44(in_stack_0000001c,num_lines) >> 3) * 0x6db6db6db6db6db7,&local_191
              );
    if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00222eca;
    iVar12 = (int)pplVar56;
    if ((long)local_120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar53 = (long)local_120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar53 = lVar53 + (ulong)(lVar53 == 0);
      piVar44 = (int *)(*(long *)CONCAT44(in_stack_0000001c,num_lines) + 0x24);
      piVar32 = &(local_120.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start)->size;
      puVar18 = (ushort *)
                local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        ((PIZChannelData *)(piVar32 + -7))->start = puVar18;
        *(ushort **)(piVar32 + -5) = puVar18;
        piVar32[-3] = param_4;
        piVar32[-2] = iVar12;
        iVar13 = *piVar44;
        *piVar32 = (iVar13 != 1) + 1;
        puVar18 = puVar18 + (iVar12 * param_4 << (iVar13 != 1));
        piVar44 = piVar44 + 0xe;
        piVar32 = piVar32 + 8;
        lVar53 = lVar53 + -1;
      } while (lVar53 != 0);
    }
    if (0 < iVar12) {
      pPVar31 = local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar20 = (void *)0x0;
      pvVar42 = local_88;
      pPVar54 = local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_1a0 = pvVar20;
        bVar61 = pPVar31 != pPVar54;
        pPVar31 = pPVar54;
        if (bVar61) {
          pplVar56 = (longlong **)0x8;
          uVar58 = 0;
          do {
            lVar53 = (long)*(int *)((long)&pPVar54->ny + (long)pplVar56) *
                     (long)*(int *)((long)&pPVar54->end + (long)pplVar56);
            __n = lVar53 * 2;
            memcpy(*(void **)((long)&pPVar54->start + (long)pplVar56),pvVar42,__n);
            pvVar42 = (void *)((long)pvVar42 + lVar53 * 2);
            plVar16 = (long *)((long)&pPVar54->start + (long)pplVar56);
            *plVar16 = *plVar16 + __n;
            uVar58 = uVar58 + 1;
            pplVar56 = pplVar56 + 4;
            pPVar31 = local_120.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pPVar54 = local_120.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar58 < (ulong)((long)local_120.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_120.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        uVar50 = (int)local_1a0 + 1;
        pvVar20 = (void *)(ulong)uVar50;
      } while (uVar50 != (uint)local_188);
    }
    puVar10 = local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar31 = (pointer)((long)local_178.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_178.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 1);
    if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar33 = 0;
      memset(local_150,0,0x2000);
      if (0 < (int)(uint)pPVar31) {
        uVar58 = 0;
        do {
          pbVar2 = (byte *)((long)&local_150->start +
                           (ulong)(*(ushort *)((long)puVar10 + uVar58 * 2) >> 3));
          *pbVar2 = *pbVar2 | (byte)(1 << ((byte)*(ushort *)((long)puVar10 + uVar58 * 2) & 7));
          uVar58 = uVar58 + 1;
        } while (((uint)pPVar31 & 0x7fffffff) != uVar58);
        bVar33 = *(byte *)&local_150->start & 0xfe;
      }
      *(byte *)&local_150->start = bVar33;
      uVar15 = 0x1fff;
      pvVar42 = (void *)0x0;
      uVar58 = 0;
      uVar55 = 0;
      do {
        if (*(uchar *)((long)&local_150->start + uVar55) != '\0') {
          uVar15 = uVar15 & 0xffff;
          bVar61 = uVar55 < uVar15;
          if (bVar61) {
            uVar15 = uVar55 & 0xffffffff;
          }
          uVar50 = (uint)uVar58;
          if (bVar61) {
            uVar50 = (uint)pvVar42;
          }
          if ((ushort)uVar50 < uVar55) {
            pvVar42 = (void *)(uVar55 & 0xffffffff);
          }
          uVar58 = (ulong)uVar50;
          if ((ushort)uVar50 < uVar55) {
            uVar58 = uVar55 & 0xffffffff;
          }
        }
        uVar55 = uVar55 + 1;
      } while (uVar55 != 0x2000);
      pvVar20 = operator_new(0x20000);
      uVar58 = 0;
      memset(pvVar20,0,0x20000);
      local_f8 = 0;
      do {
        if ((uVar58 == 0) ||
           ((*(byte *)((long)&local_150->start + (uVar58 >> 3 & 0x1fffffff)) >> ((uint)uVar58 & 7) &
            1) != 0)) {
          uVar11 = (undefined2)local_f8;
          local_f8 = (ulong)((int)local_f8 + 1);
        }
        else {
          uVar11 = 0;
        }
        *(undefined2 *)((long)pvVar20 + uVar58 * 2) = uVar11;
        uVar58 = uVar58 + 1;
      } while (uVar58 != 0x10000);
      local_e0 = (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 1;
      local_130 = (ushort *)
                  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_158 = pvVar20;
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar22 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,0);
        operator_delete(pvVar42);
        operator_delete(pplVar56);
        operator_delete(local_1a0);
        operator_delete(local_158);
        if (local_120.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((ushort *)
            local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ushort *)0x0) {
          operator_delete(local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        operator_delete(local_150);
        if ((pointer)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)CONCAT44(local_148.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_148.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_148.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (int)local_148.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start));
        }
        _Unwind_Resume(uVar22);
      }
      if (0 < (int)(uint)local_e0) {
        uVar58 = 0;
        do {
          *(ushort *)
           ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar58 * 2) =
               *(ushort *)
                ((long)pvVar20 +
                (ulong)*(ushort *)
                        ((long)local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar58 * 2) * 2);
          uVar58 = uVar58 + 1;
        } while (((uint)local_e0 & 0x7fffffff) != uVar58);
      }
      *(ushort *)&local_80->start = (ushort)uVar15;
      *(ushort *)((long)&local_80->start + 2) = (ushort)pvVar42;
      piVar32 = (int *)((long)&local_80->start + 4);
      if ((ushort)uVar15 <= (ushort)pvVar42) {
        lVar53 = ((ulong)pvVar42 & 0xffff) - (uVar15 & 0xffff);
        memcpy(piVar32,(uchar *)((long)&local_150->start + (uVar15 & 0xffff)),lVar53 + 1);
        piVar32 = (int *)((long)piVar32 + lVar53 + 1);
      }
      local_78 = local_120.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((long)local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        uVar50 = (int)local_f8 - 1;
        local_f8 = (ulong)uVar50;
        local_50 = (long)local_120.
                         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_120.
                         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
        local_50 = local_50 + (ulong)(local_50 == 0);
        lVar53 = 0;
        do {
          local_48 = lVar53;
          iVar12 = local_120.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_48].size;
          local_f0 = (long)iVar12;
          if (0 < local_f0) {
            pPVar31 = local_120.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_48;
            puVar14 = pPVar31->start;
            uVar38 = pPVar31->nx;
            local_a4 = pPVar31->ny;
            local_e4 = uVar38 * iVar12;
            local_160 = (long *)CONCAT44(local_160._4_4_,uVar38);
            local_e8 = local_a4;
            if ((int)uVar38 < (int)local_a4) {
              local_e8 = uVar38;
            }
            local_70 = (longlong **)0x0;
            local_b8 = 0;
            do {
              if (1 < (int)local_e8) {
                local_68 = puVar14 + local_b8;
                uVar58 = 2;
                uVar39 = 1;
                do {
                  local_58 = uVar58;
                  uVar46 = (uint)local_58;
                  iVar13 = (local_a4 - uVar46) * local_e4;
                  local_190 = CONCAT44(local_190._4_4_,uVar39);
                  local_60 = (long)(int)(uVar39 * iVar12);
                  lVar53 = (long)(int)(uVar46 * iVar12);
                  uVar57 = uVar50 & 0xffff;
                  puVar18 = local_68;
                  if (-1 < iVar13) {
                    local_128 = local_68 + iVar13;
                    iVar13 = (uVar38 - uVar46) * iVar12;
                    local_40 = (long)iVar13;
                    local_180 = (longlong **)(long)(int)(uVar39 * local_e4);
                    local_c8 = (ulong)(int)(uVar46 * local_e4);
                    local_38 = local_c8 * 2;
                    puVar3 = puVar14 + (long)local_180;
                    puVar59 = puVar14 + (long)((long)local_180 + local_60);
                    pplVar56 = local_70;
                    do {
                      puVar28 = puVar18;
                      if (-1 < iVar13) {
                        pplVar21 = pplVar56;
                        do {
                          uVar29 = *(ushort *)((long)puVar14 + (long)pplVar21);
                          uVar49 = *(ushort *)((long)(puVar14 + local_60) + (long)pplVar21);
                          if (uVar57 < 0x4000) {
                            iVar41 = (int)(short)uVar29 - (int)(short)uVar49;
                            iVar34 = (int)*(short *)((long)puVar3 + (long)pplVar21) -
                                     (int)*(short *)((long)puVar59 + (long)pplVar21);
                            uVar51 = (int)(short)uVar49 + (int)(short)uVar29;
                            uVar30 = (int)*(short *)((long)puVar59 + (long)pplVar21) +
                                     (int)*(short *)((long)puVar3 + (long)pplVar21);
                            iVar36 = (uVar51 >> 1) - (uVar30 >> 1);
                            uVar29 = (ushort)((uint)(((int)uVar30 >> 1) + ((int)uVar51 >> 1)) >> 1);
                            uVar49 = (ushort)((uint)((int)(short)iVar34 + (int)(short)iVar41) >> 1);
                            iVar41 = iVar41 - iVar34;
                          }
                          else {
                            uVar47 = (uVar29 ^ 0x8000) - (uint)uVar49;
                            uVar30 = *(ushort *)((long)puVar3 + (long)pplVar21) ^ 0x8000;
                            uVar51 = uVar30 - *(ushort *)((long)puVar59 + (long)pplVar21);
                            uVar52 = uVar51 >> 0x10 & 0x8000 ^
                                     uVar30 + *(ushort *)((long)puVar59 + (long)pplVar21) >> 1;
                            uVar30 = (uVar29 ^ 0x8000) + (uint)uVar49 >> 1 ^ 0x8000 ^
                                     uVar47 >> 0x10 & 0x8000;
                            iVar36 = uVar30 - uVar52;
                            uVar29 = (ushort)((uint)iVar36 >> 0x10) & 0x8000 ^
                                     (ushort)(uVar52 + uVar30 >> 1);
                            uVar30 = uVar47 & 0xffff ^ 0x8000;
                            uVar51 = uVar51 & 0xffff;
                            iVar41 = uVar30 - uVar51;
                            uVar49 = (ushort)((uint)iVar41 >> 0x10) & 0x8000 ^
                                     (ushort)(uVar51 + uVar30 >> 1);
                          }
                          *(ushort *)((long)puVar14 + (long)pplVar21) = uVar29;
                          *(short *)((long)puVar3 + (long)pplVar21) = (short)iVar36;
                          *(ushort *)((long)(puVar14 + local_60) + (long)pplVar21) = uVar49;
                          *(short *)((long)puVar59 + (long)pplVar21) = (short)iVar41;
                          pplVar21 = (longlong **)((long)pplVar21 + lVar53 * 2);
                          puVar28 = (ushort *)((long)puVar14 + (long)pplVar21);
                          pvVar20 = local_158;
                          local_188 = pplVar56;
                          local_100 = puVar18;
                        } while (puVar28 <= puVar18 + local_40);
                      }
                      if ((uVar38 & uVar39) != 0) {
                        uVar29 = *puVar28;
                        uVar49 = puVar28[(long)local_180];
                        if (uVar57 < 0x4000) {
                          uVar35 = (ushort)((uint)((int)(short)uVar49 + (int)(short)uVar29) >> 1);
                          iVar36 = (int)(short)uVar29 - (int)(short)uVar49;
                        }
                        else {
                          iVar36 = (uVar29 ^ 0x8000) - (uint)uVar49;
                          uVar35 = (ushort)((uint)iVar36 >> 0x10) & 0x8000 ^
                                   (ushort)((uVar29 ^ 0x8000) + (uint)uVar49 >> 1);
                        }
                        puVar28[(long)local_180] = (ushort)iVar36;
                        *puVar28 = uVar35;
                      }
                      puVar18 = puVar18 + local_c8;
                      pplVar56 = (longlong **)((long)pplVar56 + local_38);
                    } while (puVar18 <= local_128);
                  }
                  local_d0 = lVar53;
                  if (((uVar39 & local_a4) != 0) &&
                     (iVar13 = (uVar38 - uVar46) * iVar12, -1 < iVar13)) {
                    puVar28 = puVar18 + iVar13;
                    local_d0 = lVar53 * 2;
                    do {
                      uVar29 = *puVar18;
                      uVar49 = puVar18[local_60];
                      if (uVar57 < 0x4000) {
                        uVar35 = (ushort)((uint)((int)(short)uVar49 + (int)(short)uVar29) >> 1);
                        iVar13 = (int)(short)uVar29 - (int)(short)uVar49;
                      }
                      else {
                        iVar13 = (uVar29 ^ 0x8000) - (uint)uVar49;
                        uVar35 = (ushort)((uint)iVar13 >> 0x10) & 0x8000 ^
                                 (ushort)((uVar29 ^ 0x8000) + (uint)uVar49 >> 1);
                      }
                      puVar18[local_60] = (ushort)iVar13;
                      *puVar18 = uVar35;
                      puVar18 = puVar18 + lVar53;
                    } while (puVar18 <= puVar28);
                  }
                  uVar58 = (ulong)(uVar46 * 2);
                  uVar39 = uVar46;
                } while ((int)(uVar46 * 2) <= (int)local_e8);
              }
              local_b8 = local_b8 + 1;
              local_70 = (longlong **)((long)local_70 + 2);
            } while (local_b8 != local_f0);
          }
          lVar53 = local_48 + 1;
        } while (local_48 + 1 != local_50);
      }
      *piVar32 = 0;
      local_c0 = piVar32 + 1;
      local_b0 = piVar32;
      if ((int)local_e0 == 0) {
        iVar13 = 0;
        iVar12 = (int)local_c0;
      }
      else {
        pvVar42 = operator_new(0x80008);
        memset(pvVar42,0,0x80008);
        puVar18 = local_130;
        if (0 < (int)(uint)local_e0) {
          uVar58 = 0;
          do {
            plVar16 = (long *)((long)pvVar42 + (ulong)local_130[uVar58] * 8);
            *plVar16 = *plVar16 + 1;
            uVar58 = uVar58 + 1;
          } while (((uint)local_e0 & 0x7fffffff) != uVar58);
        }
        pvVar20 = operator_new(0x40004);
        memset(pvVar20,0,0x40004);
        pplVar56 = (longlong **)operator_new(0x80008);
        memset(pplVar56,0,0x80008);
        plVar16 = (long *)((long)pvVar42 + -8);
        local_c8 = 0xffffffffffffffff;
        do {
          local_c8 = local_c8 + 1;
          plVar1 = plVar16 + 1;
          plVar16 = plVar16 + 1;
        } while (*plVar1 == 0);
        uVar58 = local_190 >> 0x20;
        local_190 = uVar58 << 0x20;
        iVar12 = 0;
        if (local_c8 < 0x10001) {
          local_190 = uVar58 << 0x20;
          iVar12 = 0;
          uVar58 = local_c8;
          do {
            *(int *)((long)pvVar20 + uVar58 * 4) = (int)uVar58;
            if (*plVar16 != 0) {
              pplVar56[iVar12] = plVar16;
              iVar12 = iVar12 + 1;
              local_190 = CONCAT44(local_190._4_4_,(int)uVar58);
            }
            uVar58 = uVar58 + 1;
            plVar16 = plVar16 + 1;
          } while (uVar58 != 0x10001);
        }
        local_128 = (ushort *)(long)(int)local_190;
        local_160 = (long *)((long)pvVar42 + (long)local_128 * 8 + 8);
        *(undefined8 *)((long)pvVar42 + (long)local_128 * 8 + 8) = 1;
        pplVar56[iVar12] = local_160;
        std::__make_heap<long_long**,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                  (pplVar56,pplVar56 + (long)iVar12 + 1,
                   (_Iter_comp_iter<tinyexr::FHeapCompare> *)&local_191);
        hcode = (longlong *)operator_new(0x80008);
        memset(hcode,0,0x80008);
        if (0 < iVar12) {
          local_180 = pplVar56 + -1;
          puVar28 = (ushort *)(ulong)(iVar12 + 1);
          do {
            plVar6 = *pplVar56;
            plVar7 = pplVar56[(long)puVar28 + -1];
            pplVar56[(long)puVar28 + -1] = plVar6;
            std::
            __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                      (pplVar56,0,
                       (long)((long)local_180 + ((long)puVar28 * 8 - (long)pplVar56)) >> 3,plVar7);
            puVar24 = (ushort *)((long)puVar28 - 1);
            plVar7 = *pplVar56;
            pplVar21 = pplVar56 + (long)puVar28 + -1;
            if ((ushort *)0x1 < puVar24) {
              plVar8 = pplVar56[(long)(puVar28 + -1)];
              pplVar56[(long)(puVar28 + -1)] = plVar7;
              local_188 = pplVar56 + (long)puVar28 + -1;
              local_100 = puVar24;
              std::
              __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                        (pplVar56,0,(long)puVar28 * 8 + -0x10 >> 3,plVar8);
              pplVar21 = local_188;
              puVar24 = local_100;
            }
            uVar58 = (ulong)((long)plVar6 - (long)pvVar42) >> 3;
            uVar55 = (ulong)((long)plVar7 - (long)pvVar42) >> 3;
            iVar12 = (int)uVar58;
            lVar53 = (long)iVar12;
            plVar16 = (long *)((long)pvVar42 + (long)(int)uVar55 * 8);
            *plVar16 = *plVar16 + *(long *)((long)pvVar42 + lVar53 * 8);
            puVar18 = puVar28 + -1;
            plVar16 = pplVar21[-1];
            if ((ushort *)0x1 < puVar24) {
              lVar23 = *plVar16;
              do {
                uVar15 = (long)puVar18 - 1;
                puVar40 = (ushort *)(uVar15 >> 1);
                if (*pplVar56[(long)puVar40] <= lVar23) goto LAB_00222717;
                pplVar56[(long)puVar18] = pplVar56[(long)puVar40];
                puVar18 = puVar40;
              } while (1 < uVar15);
              puVar18 = (ushort *)0x0;
            }
LAB_00222717:
            pplVar56[(long)puVar18] = plVar16;
            do {
              uVar50 = (uint)uVar55;
              lVar26 = (long)(int)uVar50;
              lVar23 = hcode[lVar26];
              hcode[lVar26] = lVar23 + 1;
              if (0x39 < lVar23) {
LAB_00222dd8:
                __assert_fail("scode[j] <= 58",
                              "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                              ,0x8f5,"void tinyexr::hufBuildEncTable(long long *, int *, int *)");
              }
              uVar38 = *(uint *)((long)pvVar20 + lVar26 * 4);
              uVar55 = (ulong)uVar38;
            } while (uVar38 != uVar50);
            *(int *)((long)pvVar20 + lVar26 * 4) = iVar12;
            lVar23 = hcode[lVar53];
            hcode[lVar53] = lVar23 + 1;
            while( true ) {
              if (0x39 < lVar23) {
                __assert_fail("scode[j] <= 58",
                              "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                              ,0x908,"void tinyexr::hufBuildEncTable(long long *, int *, int *)");
              }
              uVar50 = *(uint *)((long)pvVar20 + lVar53 * 4);
              if (uVar50 == (uint)uVar58) break;
              lVar53 = (long)(int)uVar50;
              lVar23 = hcode[lVar53];
              hcode[lVar53] = lVar23 + 1;
              uVar58 = (ulong)uVar50;
            }
            bVar61 = 2 < (long)puVar28;
            puVar18 = local_130;
            puVar28 = puVar24;
          } while (bVar61);
        }
        puVar28 = (ushort *)((long)local_128 + 1);
        hufCanonicalCodeTable(hcode);
        memcpy(pvVar42,hcode,0x80008);
        operator_delete(hcode);
        operator_delete(pplVar56);
        operator_delete(pvVar20);
        piVar32 = local_b0;
        pvVar20 = local_158;
        local_180 = (longlong **)(local_b0 + 6);
        pplVar56 = local_180;
        if ((int)local_c8 <= (int)puVar28) {
          uVar58 = 0;
          uVar15 = local_c8 & 0xffffffff;
          uVar55 = 0;
          do {
            iVar13 = (int)uVar15;
            lVar53 = (long)iVar13;
            uVar15 = *(ulong *)((long)pvVar42 + lVar53 * 8) & 0x3f;
            iVar12 = (int)uVar58;
            if ((int)local_190 < iVar13 || uVar15 != 0) {
LAB_0022285c:
              uVar55 = uVar55 << 6 | uVar15;
              if (iVar12 < 2) {
LAB_002228f8:
                uVar58 = (ulong)(iVar12 + 6);
              }
              else {
                uVar58 = (ulong)(iVar12 + 6);
                do {
                  uVar58 = uVar58 - 8;
                  *(char *)pplVar56 = (char)((long)uVar55 >> ((byte)uVar58 & 0x3f));
                  pplVar56 = (longlong **)((long)pplVar56 + 1);
                } while (7 < uVar58);
              }
            }
            else {
              uVar50 = 1;
              while (uVar38 = uVar50, (*(byte *)((long)pvVar42 + lVar53 * 8 + 8) & 0x3f) == 0) {
                lVar53 = lVar53 + 1;
                uVar38 = uVar50 + 1;
                if (((long)puVar28 <= lVar53) || (bVar61 = 0x103 < uVar50, uVar50 = uVar38, bVar61))
                break;
              }
              iVar13 = (int)lVar53;
              if (uVar38 < 2) goto LAB_0022285c;
              if (uVar38 < 6) {
                uVar55 = uVar55 << 6 | (ulong)(uVar38 + 0x39);
                if (1 < iVar12) {
                  uVar58 = (ulong)(iVar12 + 6);
                  do {
                    uVar58 = uVar58 - 8;
                    *(char *)pplVar56 = (char)((long)uVar55 >> ((byte)uVar58 & 0x3f));
                    pplVar56 = (longlong **)((long)pplVar56 + 1);
                  } while (7 < uVar58);
                  goto LAB_002228fa;
                }
                goto LAB_002228f8;
              }
              uVar58 = uVar55 << 6 | 0x3f;
              if (iVar12 < 2) {
                uVar55 = uVar58 << 8 | (ulong)(uVar38 - 6);
                uVar50 = iVar12 + 0xe;
                uVar58 = (ulong)uVar50;
                if ((int)(iVar12 + 6U) < 0) goto LAB_002228fa;
              }
              else {
                uVar55 = (ulong)(iVar12 + 6U);
                uVar50 = iVar12 + 0xe;
                do {
                  uVar55 = uVar55 - 8;
                  *(char *)pplVar56 = (char)((long)uVar58 >> ((byte)uVar55 & 0x3f));
                  pplVar56 = (longlong **)((long)pplVar56 + 1);
                  uVar50 = uVar50 - 8;
                } while (7 < uVar55);
                uVar55 = uVar58 << 8 | (ulong)(uVar38 - 6);
              }
              uVar58 = (ulong)uVar50;
              do {
                uVar58 = uVar58 - 8;
                *(char *)pplVar56 = (char)((long)uVar55 >> ((byte)uVar58 & 0x3f));
                pplVar56 = (longlong **)((long)pplVar56 + 1);
              } while (7 < uVar58);
            }
LAB_002228fa:
            uVar15 = (ulong)(iVar13 + 1);
          } while (iVar13 <= (int)local_190);
          if (0 < (int)uVar58) {
            *(char *)pplVar56 = (char)(uVar55 << (8U - (char)uVar58 & 0x3f));
            pplVar56 = (longlong **)((long)pplVar56 + 1);
          }
        }
        uVar29 = *puVar18;
        pplVar21 = pplVar56;
        if ((int)(uint)local_e0 < 2) {
          uVar55 = 0;
          uVar58 = 0;
          iVar12 = 0;
        }
        else {
          iVar12 = 0;
          uVar15 = 1;
          uVar58 = 0;
          uVar55 = 0;
          do {
            if (iVar12 < 0xff && uVar29 == puVar18[uVar15]) {
              iVar13 = iVar12 + 1;
            }
            else {
              lVar53 = *(long *)((long)pvVar42 + (ulong)uVar29 * 8);
              lVar23 = *local_160;
              uVar57 = (uint)lVar53;
              uVar38 = uVar57 & 0x3f;
              uVar50 = (uint)lVar23;
              uVar39 = uVar50 & 0x3f;
              uVar60 = (ulong)iVar12;
              uVar37 = lVar53 >> 6;
              puVar18 = local_130;
              if ((long)((ulong)uVar38 + (ulong)uVar39 + 8) < (long)(uVar38 * uVar60)) {
                uVar37 = uVar55 << (sbyte)uVar38 | uVar37;
                uVar38 = (uVar57 & 0x3f) + (int)uVar58;
                uVar58 = (ulong)uVar38;
                if (7 < (int)uVar38) {
                  uVar58 = (ulong)uVar38;
                  do {
                    uVar58 = uVar58 - 8;
                    *(char *)pplVar21 = (char)((long)uVar37 >> ((byte)uVar58 & 0x3f));
                    pplVar21 = (longlong **)((long)pplVar21 + 1);
                  } while (7 < uVar58);
                }
                uVar50 = uVar50 & 0x3f;
                uVar55 = uVar37 << (sbyte)uVar39 | lVar23 >> 6;
                uVar38 = (int)uVar58 + uVar50;
                if ((int)uVar38 < 8) {
                  uVar50 = uVar38 + 8;
                  uVar58 = (ulong)uVar50;
                  uVar55 = uVar55 << 8 | uVar60;
                  if (-1 < (int)uVar38) goto LAB_00222abf;
                }
                else {
                  uVar37 = (ulong)uVar38;
                  uVar50 = uVar50 + (int)uVar58 + 8;
                  do {
                    uVar37 = uVar37 - 8;
                    *(char *)pplVar21 = (char)((long)uVar55 >> ((byte)uVar37 & 0x3f));
                    pplVar21 = (longlong **)((long)pplVar21 + 1);
                    uVar50 = uVar50 - 8;
                  } while (7 < uVar37);
                  uVar55 = uVar55 << 8 | uVar60;
LAB_00222abf:
                  uVar58 = (ulong)uVar50;
                  do {
                    uVar58 = uVar58 - 8;
                    *(char *)pplVar21 = (char)((long)uVar55 >> ((byte)uVar58 & 0x3f));
                    pplVar21 = (longlong **)((long)pplVar21 + 1);
                  } while (7 < uVar58);
                }
                iVar13 = 0;
              }
              else {
                iVar13 = 0;
                if (-1 < iVar12) {
                  do {
                    uVar50 = (int)uVar58 + (uVar57 & 0x3f);
                    uVar58 = (ulong)uVar50;
                    uVar55 = uVar55 << (sbyte)uVar38 | uVar37;
                    if (7 < (int)uVar50) {
                      uVar58 = (ulong)uVar50;
                      do {
                        uVar58 = uVar58 - 8;
                        *(char *)pplVar21 = (char)((long)uVar55 >> ((byte)uVar58 & 0x3f));
                        pplVar21 = (longlong **)((long)pplVar21 + 1);
                      } while (7 < uVar58);
                    }
                    bVar61 = 0 < iVar12;
                    iVar12 = iVar12 + -1;
                  } while (bVar61);
                }
              }
            }
            iVar12 = iVar13;
            uVar29 = puVar18[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar15 != ((uint)local_e0 & 0x7fffffff));
        }
        lVar53 = *(long *)((long)pvVar42 + (ulong)uVar29 * 8);
        lVar23 = *local_160;
        uVar57 = (uint)lVar53;
        uVar38 = uVar57 & 0x3f;
        uVar50 = (uint)lVar23;
        uVar39 = uVar50 & 0x3f;
        uVar15 = (ulong)iVar12;
        uVar37 = lVar53 >> 6;
        if ((long)((ulong)uVar38 + (ulong)uVar39 + 8) < (long)(uVar38 * uVar15)) {
          uVar37 = uVar55 << (sbyte)uVar38 | uVar37;
          uVar38 = (uVar57 & 0x3f) + (int)uVar58;
          uVar58 = (ulong)uVar38;
          if (7 < (int)uVar38) {
            uVar58 = (ulong)uVar38;
            do {
              uVar58 = uVar58 - 8;
              *(char *)pplVar21 = (char)((long)uVar37 >> ((byte)uVar58 & 0x3f));
              pplVar21 = (longlong **)((long)pplVar21 + 1);
            } while (7 < uVar58);
          }
          uVar50 = uVar50 & 0x3f;
          uVar55 = uVar37 << (sbyte)uVar39 | lVar23 >> 6;
          uVar38 = (int)uVar58 + uVar50;
          if ((int)uVar38 < 8) {
            uVar50 = uVar38 + 8;
            uVar58 = (ulong)uVar50;
            uVar55 = uVar55 << 8 | uVar15;
            if ((int)uVar38 < 0) goto LAB_00222c12;
          }
          else {
            uVar37 = (ulong)uVar38;
            uVar50 = uVar50 + (int)uVar58 + 8;
            do {
              uVar37 = uVar37 - 8;
              *(char *)pplVar21 = (char)((long)uVar55 >> ((byte)uVar37 & 0x3f));
              pplVar21 = (longlong **)((long)pplVar21 + 1);
              uVar50 = uVar50 - 8;
            } while (7 < uVar37);
            uVar55 = uVar55 << 8 | uVar15;
          }
          uVar58 = (ulong)uVar50;
          do {
            uVar58 = uVar58 - 8;
            *(char *)pplVar21 = (char)((long)uVar55 >> ((byte)uVar58 & 0x3f));
            pplVar21 = (longlong **)((long)pplVar21 + 1);
          } while (7 < uVar58);
        }
        else if (-1 < iVar12) {
          do {
            uVar50 = (int)uVar58 + (uVar57 & 0x3f);
            uVar58 = (ulong)uVar50;
            uVar55 = uVar55 << (sbyte)uVar38 | uVar37;
            if (7 < (int)uVar50) {
              uVar58 = (ulong)uVar50;
              do {
                uVar58 = uVar58 - 8;
                *(char *)pplVar21 = (char)((long)uVar55 >> ((byte)uVar58 & 0x3f));
                pplVar21 = (longlong **)((long)pplVar21 + 1);
              } while (7 < uVar58);
            }
            bVar61 = 0 < iVar12;
            iVar12 = iVar12 + -1;
          } while (bVar61);
        }
LAB_00222c12:
        iVar12 = (int)uVar58;
        if (iVar12 != 0) {
          *(char *)pplVar21 = (char)(uVar55 << (8U - (char)uVar58 & 0x3f));
        }
        iVar41 = (int)pplVar21 - (int)pplVar56;
        lVar53 = (long)pplVar56 - (long)local_180;
        iVar36 = iVar12 + iVar41 * 8 + 7;
        iVar13 = iVar12 + iVar41 * 8 + 0xe;
        if (-1 < iVar36) {
          iVar13 = iVar36;
        }
        *(char *)(local_b0 + 1) = (char)local_c8;
        *(char *)((long)local_b0 + 5) = (char)(local_c8 >> 8);
        *(char *)((long)local_b0 + 6) = (char)(local_c8 >> 0x10);
        *(char *)((long)local_b0 + 7) = (char)(local_c8 >> 0x18);
        *(char *)(local_b0 + 2) = (char)puVar28;
        *(char *)((long)local_b0 + 9) = (char)((ulong)puVar28 >> 8);
        *(char *)((long)local_b0 + 10) = (char)((ulong)puVar28 >> 0x10);
        *(char *)((long)local_b0 + 0xb) = (char)((ulong)puVar28 >> 0x18);
        *(char *)(local_b0 + 3) = (char)lVar53;
        *(char *)((long)local_b0 + 0xd) = (char)((ulong)lVar53 >> 8);
        *(char *)((long)local_b0 + 0xe) = (char)((ulong)lVar53 >> 0x10);
        *(char *)((long)local_b0 + 0xf) = (char)((ulong)lVar53 >> 0x18);
        iVar12 = iVar12 + iVar41 * 8;
        *(char *)(local_b0 + 4) = (char)iVar12;
        *(char *)((long)local_b0 + 0x11) = (char)((uint)iVar12 >> 8);
        *(char *)((long)local_b0 + 0x12) = (char)((uint)iVar12 >> 0x10);
        *(char *)((long)local_b0 + 0x13) = (char)((uint)iVar12 >> 0x18);
        iVar12 = (int)local_c0;
        iVar13 = ((iVar13 >> 3) + (int)pplVar56) - iVar12;
        local_b0[5] = 0;
        local_128 = puVar28;
        operator_delete(pvVar42);
      }
      uVar58 = local_108;
      *piVar32 = iVar13;
      uVar55 = (ulong)(uint)((iVar12 - (int)local_80) + iVar13);
      if (local_108 <= uVar55) {
        memcpy(local_80,local_88,local_108);
        uVar55 = uVar58 & 0xffffffff;
      }
      operator_delete(pvVar20);
      pPVar31 = local_150;
      if (local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((ushort *)
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (ushort *)0x0) {
        operator_delete(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(pPVar31);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_d8,*(undefined8 *)(local_d8 + 8),
                 local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (uchar *)((long)(unsigned_short **)
                                 local_a0.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar55));
      local_120.
      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
LAB_00222d63:
      if (local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00222d6d;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,pPVar31);
LAB_00222eef:
  __assert_fail("outSize > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                ,0x650,
                "void tinyexr::CompressRle(unsigned char *, tinyexr::tinyexr_uint64 &, const unsigned char *, unsigned long)"
               );
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if TINYEXR_USE_MINIZ
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()));

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}